

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O2

double kj::_::anon_unknown_0::NoLocaleStrtod(char *text,char **original_endptr)

{
  double dVar1;
  char *pcVar2;
  size_t sVar3;
  StringPtr *in_R8;
  int iVar4;
  char *__nptr;
  undefined4 uVar5;
  undefined4 uVar6;
  String localized;
  int size;
  Fault f;
  undefined8 local_80;
  char *localized_endptr;
  undefined8 uStack_70;
  double local_60;
  char *temp_endptr;
  ArrayPtr<char> local_50;
  ArrayPtr<const_char> local_40;
  
  dVar1 = strtod(text,&temp_endptr);
  uVar5 = SUB84(dVar1,0);
  uVar6 = (undefined4)((ulong)dVar1 >> 0x20);
  if (original_endptr != (char **)0x0) {
    *original_endptr = temp_endptr;
  }
  if (*temp_endptr == '.') {
    localized_endptr = (char *)0x0;
    uStack_70 = 0;
    size = snprintf((char *)&localized_endptr,0x10,"%.1f",0);
    localized.content.size_._0_1_ = 0x31;
    localized.content.disposer = (ArrayDisposer *)anon_var_dwarf_1f258;
    if ((char)localized_endptr != '1') {
      localized.content.ptr = (char *)&localized_endptr;
      Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<char&,char>&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string.c++"
                 ,0x20f,FAILED,"temp[0] == \'1\'","_kjCondition,",
                 (DebugComparison<char_&,_char> *)&localized);
      Debug::Fault::fatal(&f);
    }
    localized.content.ptr = (char *)((long)&local_80 + (long)size + 7);
    localized.content.size_._0_1_ = 0x35;
    localized.content.disposer = (ArrayDisposer *)anon_var_dwarf_1f258;
    if (*localized.content.ptr != '5') {
      Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<char&,char>&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string.c++"
                 ,0x210,FAILED,"temp[size-1] == \'5\'","_kjCondition,",
                 (DebugComparison<char_&,_char> *)&localized);
      Debug::Fault::fatal(&f);
    }
    localized.content.ptr = (char *)&size;
    localized.content.size_._0_4_ = 6;
    localized.content.disposer = (ArrayDisposer *)anon_var_dwarf_17814a;
    if (6 < size) {
      Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<int&,int>&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string.c++"
                 ,0x211,FAILED,"size <= 6","_kjCondition,",(DebugComparison<int_&,_int> *)&localized
                );
      Debug::Fault::fatal(&f);
    }
    local_40.ptr = (char *)((long)&localized_endptr + 1);
    local_40.size_ = (size_t)(size + -2);
    f.exception = (Exception *)text;
    local_80 = (long)temp_endptr - (long)text;
    sVar3 = strlen(temp_endptr + 1);
    local_50.size_ = sVar3 + 1;
    local_50.ptr = temp_endptr + 1;
    str<kj::ArrayPtr<char_const>,kj::ArrayPtr<char>,kj::StringPtr>
              (&localized,(kj *)&f,&local_40,&local_50,in_R8);
    __nptr = localized.content.ptr;
    if (CONCAT44(localized.content.size_._4_4_,(int)localized.content.size_) == 0) {
      __nptr = "";
    }
    local_60 = strtod(__nptr,&localized_endptr);
    pcVar2 = localized_endptr;
    if ((original_endptr != (char **)0x0) &&
       ((long)temp_endptr - (long)text < (long)localized_endptr - (long)__nptr)) {
      iVar4 = 0;
      if (CONCAT44(localized.content.size_._4_4_,(int)localized.content.size_) != 0) {
        iVar4 = (int)localized.content.size_ + -1;
      }
      sVar3 = strlen(text);
      *original_endptr = text + ((long)pcVar2 - (long)(__nptr + (iVar4 - (int)sVar3)));
    }
    Array<char>::~Array(&localized.content);
    uVar5 = SUB84(local_60,0);
    uVar6 = (undefined4)((ulong)local_60 >> 0x20);
  }
  return (double)CONCAT44(uVar6,uVar5);
}

Assistant:

double NoLocaleStrtod(const char* text, char** original_endptr) {
  // We cannot simply set the locale to "C" temporarily with setlocale()
  // as this is not thread-safe.  Instead, we try to parse in the current
  // locale first.  If parsing stops at a '.' character, then this is a
  // pretty good hint that we're actually in some other locale in which
  // '.' is not the radix character.

  char* temp_endptr;
  double result = strtod(text, &temp_endptr);
  if (original_endptr != NULL) *original_endptr = temp_endptr;
  if (*temp_endptr != '.') return result;

  // Parsing halted on a '.'.  Perhaps we're in a different locale?  Let's
  // try to replace the '.' with a locale-specific radix character and
  // try again.
  kj::String localized = LocalizeRadix(text, temp_endptr);
  const char* localized_cstr = localized.cStr();
  char* localized_endptr;
  result = strtod(localized_cstr, &localized_endptr);
  if ((localized_endptr - localized_cstr) >
      (temp_endptr - text)) {
    // This attempt got further, so replacing the decimal must have helped.
    // Update original_endptr to point at the right location.
    if (original_endptr != NULL) {
      // size_diff is non-zero if the localized radix has multiple bytes.
      int size_diff = localized.size() - strlen(text);
      // const_cast is necessary to match the strtod() interface.
      *original_endptr = const_cast<char*>(
        text + (localized_endptr - localized_cstr - size_diff));
    }
  }

  return result;
}